

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginElemSegment
          (BinaryReaderInterp *this,Index index,Index table_index,uint8_t flags)

{
  Result RVar1;
  SegmentKind kind;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_1d8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  Location loc;
  FuncDesc local_170;
  Location loc_1;
  Var local_78;
  
  kind = Declared;
  if ((~(uint)flags & 3) != 0) {
    kind = flags & Passive;
  }
  loc.field_1._8_8_ = loc.field_1._8_8_ & 0xffffffff00000000;
  loc.filename._M_len = (this->filename_)._M_len;
  loc.filename._M_str = (this->filename_)._M_str;
  loc.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc_1.field_1.field_0.last_column = 0;
  loc_1.filename._M_len = (this->filename_)._M_len;
  loc_1.filename._M_str = (this->filename_)._M_str;
  loc_1.field_1.field_1.offset = loc.field_1.field_1.offset;
  Var::Var(&local_78,table_index,&loc_1);
  RVar1 = SharedValidator::OnElemSegment(&this->validator_,&loc,&local_78,kind);
  Var::~Var(&local_78);
  if (RVar1.enum_ != Error) {
    local_1d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    loc.filename._M_len = 0xffffffffffffffff;
    local_1b8 = 0;
    uStack_1b0 = 0;
    local_1a8 = 0;
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_1b8,&loc);
    FuncType::FuncType((FuncType *)&loc_1,(ValueTypes *)&local_1d8,(ValueTypes *)&local_1b8);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_1b8);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_1d8);
    loc.filename._M_len = 0;
    loc.filename._M_str = (char *)0x0;
    loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    loc.field_1._8_8_ = 0xffffffffffffffc0;
    FuncDesc::FuncDesc(&local_170,(FuncDesc *)&loc_1);
    std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::push_back
              (&this->module_->elems,(value_type *)&loc);
    ElemDesc::~ElemDesc((value_type *)&loc);
    FuncDesc::~FuncDesc((FuncDesc *)&loc_1);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::BeginElemSegment(Index index,
                                            Index table_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnElemSegment(GetLocation(),
                                        Var(table_index, GetLocation()), mode));

  FuncDesc init_func{
      FuncType{{}, {ValueType::I32}}, {}, Istream::kInvalidOffset, {}};
  ElemDesc desc{{}, ValueType::Void, mode, table_index, init_func};
  module_.elems.push_back(desc);
  return Result::Ok;
}